

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O1

void __thiscall
EncoderMD::EmitRexByte
          (EncoderMD *this,BYTE *prexByte,BYTE rexByte,bool skipRexByte,bool reservedRexByte)

{
  List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BYTE *pBVar5;
  Type *pTVar6;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,skipRexByte) != 0) {
    if ((rexByte & 0xf) == 8) {
      if (!reservedRexByte) {
        return;
      }
      if (this->m_pc <= prexByte) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                           ,0x57a,"(m_pc > prexByte)","m_pc > prexByte");
        if (!bVar3) goto LAB_0064748e;
        *puVar4 = 0;
      }
      pBVar5 = prexByte;
      if (prexByte < this->m_pc) {
        do {
          *pBVar5 = pBVar5[1];
          pBVar5 = pBVar5 + 1;
        } while (pBVar5 < this->m_pc);
      }
      pLVar1 = this->m_relocList;
      if (pLVar1 == (List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)0x0) {
        return;
      }
      pTVar6 = JsUtil::
               List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(pLVar1,(pLVar1->
                             super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
                             ).count + -1);
      if (pTVar6->m_ptr <= prexByte) {
        return;
      }
      if (this->m_pc <= pTVar6->m_ptr) {
        return;
      }
      if (pTVar6->m_type != RelocTypeLabel) {
LAB_00647360:
        pTVar6->m_ptr = (void *)((long)pTVar6->m_ptr + -1);
        pTVar6->m_origPtr = (void *)((long)pTVar6->m_origPtr + -1);
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                         ,0x588,"(lastRelocEntry.m_type != RelocTypeLabel)",
                         "lastRelocEntry.m_type != RelocTypeLabel");
      if (bVar3) {
        *puVar4 = 0;
        goto LAB_00647360;
      }
      goto LAB_0064748e;
    }
    rexByte = rexByte & 0xf7;
  }
  if (!reservedRexByte) {
    if (this->m_pc <= prexByte) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                         ,0x598,"(m_pc > prexByte)","m_pc > prexByte");
      if (!bVar3) goto LAB_0064748e;
      *puVar4 = 0;
    }
    for (pBVar5 = this->m_pc; prexByte < pBVar5; pBVar5 = pBVar5 + -1) {
      *pBVar5 = pBVar5[-1];
    }
    pLVar1 = this->m_relocList;
    if (pLVar1 != (List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   *)0x0) {
      pTVar6 = JsUtil::
               List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(pLVar1,(pLVar1->
                             super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
                             ).count + -1);
      if ((prexByte < pTVar6->m_ptr) && (pTVar6->m_ptr < this->m_pc)) {
        if (pTVar6->m_type == RelocTypeLabel) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/EncoderMD.cpp"
                             ,0x5a6,"(lastRelocEntry.m_type != RelocTypeLabel)",
                             "lastRelocEntry.m_type != RelocTypeLabel");
          if (!bVar3) {
LAB_0064748e:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar4 = 0;
        }
        pTVar6->m_ptr = (void *)((long)pTVar6->m_ptr + 1);
        pTVar6->m_origPtr = (void *)((long)pTVar6->m_origPtr + 1);
      }
    }
    this->m_pc = this->m_pc + 1;
  }
  *prexByte = rexByte;
  return;
}

Assistant:

void
EncoderMD::EmitRexByte(BYTE * prexByte, BYTE rexByte, bool skipRexByte, bool reservedRexByte)
{
    if (skipRexByte)
    {
        // REX byte is not needed - let's remove it and move everything else by 1 byte
        if (((rexByte)& 0x0F) == 0x8)
        {
            // If we didn't reserve the rex byte, we don't have to do anything
            if (reservedRexByte)
            {
                Assert(m_pc > prexByte);
                BYTE* current = prexByte;
                while (current < m_pc)
                {
                    *current = *(current + 1);
                    current++;
                }

                if (m_relocList != nullptr)
                {
                    // if a reloc record was added as part of encoding this instruction - fix the pc in the reloc
                    EncodeRelocAndLabels &lastRelocEntry = m_relocList->Item(m_relocList->Count() - 1);
                    if (lastRelocEntry.m_ptr > prexByte && lastRelocEntry.m_ptr < m_pc)
                    {
                        Assert(lastRelocEntry.m_type != RelocTypeLabel);
                        lastRelocEntry.m_ptr = (BYTE*)lastRelocEntry.m_ptr - 1;
                        lastRelocEntry.m_origPtr = (BYTE*)lastRelocEntry.m_origPtr - 1;
                    }
                }
            }
            return;
        }

        rexByte = rexByte & 0xF7;
    }

    // If we didn't reserve the rex byte, we need to move everything by 1 and make
    // room for it.
    if (!reservedRexByte)
    {
        Assert(m_pc > prexByte);
        BYTE* current = m_pc;
        while (current > prexByte)
        {
            *current = *(current - 1);
            current--;
        }

        if (m_relocList != nullptr)
        {
            // if a reloc record was added as part of encoding this instruction - fix the pc in the reloc
            EncodeRelocAndLabels &lastRelocEntry = m_relocList->Item(m_relocList->Count() - 1);
            if (lastRelocEntry.m_ptr > prexByte && lastRelocEntry.m_ptr < m_pc)
            {
                Assert(lastRelocEntry.m_type != RelocTypeLabel);
                lastRelocEntry.m_ptr = (BYTE*)lastRelocEntry.m_ptr + 1;
                lastRelocEntry.m_origPtr = (BYTE*)lastRelocEntry.m_origPtr + 1;
            }
        }
        m_pc++;
    }

    // Emit the rex byte
    *prexByte = rexByte;
}